

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamReaderPrivate::OpenIndex(BamReaderPrivate *this,string *indexFilename)

{
  bool bVar1;
  string message;
  string bracError;
  BamRandomAccessController *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  allocator *paVar2;
  RuleToken *__lhs;
  allocator local_b1;
  string local_b0 [55];
  allocator<char> local_79;
  string local_78 [8];
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  string local_58 [32];
  string local_38 [55];
  byte local_1;
  
  bVar1 = BamRandomAccessController::OpenIndex
                    ((BamRandomAccessController *)bracError.field_2._8_8_,
                     (string *)bracError.field_2._M_allocated_capacity,
                     (BamReaderPrivate *)bracError._M_string_length);
  if (bVar1) {
    local_1 = 1;
  }
  else {
    BamRandomAccessController::GetErrorString_abi_cxx11_(in_stack_ffffffffffffff28);
    __lhs = (RuleToken *)&local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"could not open index: \n\t",(allocator *)__lhs);
    std::operator+(__lhs,in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    paVar2 = &local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"BamReader::OpenIndex",paVar2);
    SetErrorString((BamReaderPrivate *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    local_1 = 0;
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_38);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamReaderPrivate::OpenIndex(const std::string& indexFilename)
{

    if (m_randomAccessController.OpenIndex(indexFilename, this))
        return true;
    else {
        const std::string bracError = m_randomAccessController.GetErrorString();
        const std::string message = std::string("could not open index: \n\t") + bracError;
        SetErrorString("BamReader::OpenIndex", message);
        return false;
    }
}